

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

void __thiscall Util::EGM96Grav::LoadNormCoeffs(EGM96Grav *this,string *C_file,string *S_file)

{
  string *in_RDX;
  string *in_RSI;
  int in_stack_00000390;
  int in_stack_00000394;
  string *in_stack_00000398;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff38;
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  string local_98 [72];
  string local_50 [32];
  Matrix<double,__1,__1,_0,__1,__1> local_30 [2];
  
  std::__cxx11::string::string(local_50,in_RSI);
  LoadDatFile(in_stack_00000398,in_stack_00000394,in_stack_00000390);
  this_00 = local_30;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(this_00,in_stack_ffffffffffffff38);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x132120);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::string(local_98,in_RDX);
  LoadDatFile(in_stack_00000398,in_stack_00000394,in_stack_00000390);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(this_00,in_stack_ffffffffffffff38);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x132173);
  std::__cxx11::string::~string(local_98);
  return;
}

Assistant:

void EGM96Grav::LoadNormCoeffs(std::string C_file, std::string S_file){

		this->C_norm_ = LoadDatFile(C_file, 361, 361);
		this->S_norm_ = LoadDatFile(S_file, 361, 361);

	}